

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O2

FieldBase * __thiscall FIX::FieldMap::reverse_find(FieldMap *this,int tag)

{
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  __tmp;
  FieldNotFound *this_00;
  allocator<char> local_59;
  pointer local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>_>
  local_50;
  const_reverse_iterator iter;
  string local_40;
  
  local_50.current._M_current =
       (__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
        )(this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  local_58 = (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
             _M_impl.super__Vector_impl_data._M_start;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>,FIX::FieldMap::finder>
            (&iter,&local_50,(finder)(int)&local_58);
  if (iter.current._M_current !=
      (__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
       )(this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl
        .super__Vector_impl_data._M_start) {
    return (FieldBase *)((long)iter.current._M_current + -0x60);
  }
  this_00 = (FieldNotFound *)__cxa_allocate_exception(0x58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_59);
  FieldNotFound::FieldNotFound(this_00,tag,&local_40);
  __cxa_throw(this_00,&FieldNotFound::typeinfo,Exception::~Exception);
}

Assistant:

const FieldBase& reverse_find( int tag ) const
  {
    Fields::const_reverse_iterator iter = std::find_if( m_fields.rbegin(), m_fields.rend(), finder( tag ) );
    if( iter == m_fields.rend() )
      throw FieldNotFound( tag );

    return *iter;
  }